

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawWallRevSubClamp4PalCommand::Execute
          (DrawWallRevSubClamp4PalCommand *this,DrawerThread *thread)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int i;
  long lVar13;
  uint uVar14;
  uint8_t *puVar15;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  puVar15 = (this->super_PalWall4Command)._dest;
  iVar2 = (this->super_PalWall4Command)._fracbits;
  puVar6 = (this->super_PalWall4Command)._srcblend;
  puVar7 = (this->super_PalWall4Command)._destblend;
  local_48 = *(undefined8 *)(this->super_PalWall4Command)._texturefrac;
  uStack_40 = *(undefined8 *)((this->super_PalWall4Command)._texturefrac + 2);
  local_58 = *(undefined8 *)(this->super_PalWall4Command)._iscale;
  uStack_50 = *(undefined8 *)((this->super_PalWall4Command)._iscale + 2);
  iVar8 = DrawerThread::count_for_thread
                    (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y,
                     (this->super_PalWall4Command)._count);
  if (0 < iVar8) {
    local_38 = (long)(this->super_PalWall4Command)._pitch;
    iVar9 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y);
    iVar10 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y);
    iVar3 = thread->num_cores;
    for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
      iVar4 = *(int *)((long)&local_58 + lVar13 * 4);
      piVar1 = (int *)((long)&local_48 + lVar13 * 4);
      *piVar1 = *piVar1 + iVar4 * iVar9;
      *(int *)((long)&local_58 + lVar13 * 4) = iVar4 * iVar3;
    }
    puVar15 = puVar15 + iVar10 * local_38;
    do {
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        uVar5 = *(uint *)((long)&local_48 + lVar13 * 4);
        uVar12 = (ulong)(this->super_PalWall4Command)._source[lVar13][uVar5 >> ((byte)iVar2 & 0x3f)]
        ;
        if (uVar12 != 0) {
          uVar14 = (puVar7[puVar15[lVar13]] | 0x40100400) -
                   puVar6[(this->super_PalWall4Command)._colormap[lVar13][uVar12]];
          uVar11 = uVar14 & 0x40100400;
          uVar11 = uVar11 - (uVar11 >> 5) & uVar14 | 0x1f07c1f;
          puVar15[lVar13] = RGB32k.All[uVar11 >> 0xf & uVar11];
        }
        *(uint *)((long)&local_48 + lVar13 * 4) = uVar5 + *(int *)((long)&local_58 + lVar13 * 4);
      }
      puVar15 = puVar15 + (this->super_PalWall4Command)._pitch;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  return;
}

Assistant:

void DrawWallRevSubClamp4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		uint32_t dc_wall_texturefrac[4] = { _texturefrac[0], _texturefrac[1], _texturefrac[2], _texturefrac[3] };
		uint32_t dc_wall_iscale[4] = { _iscale[0], _iscale[1], _iscale[2], _iscale[3] };

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int i = 0; i < 4; i++)
		{
			dc_wall_texturefrac[i] += dc_wall_iscale[i] * skipped;
			dc_wall_iscale[i] *= thread->num_cores;
		}
		pitch *= thread->num_cores;

		do
		{
			for (int i = 0; i < 4; ++i)
			{
				uint8_t pix = _source[i][dc_wall_texturefrac[i] >> bits];
				if (pix != 0)
				{
					uint32_t a = (bg2rgb[dest[i]] | 0x40100400) - fg2rgb[_colormap[i][pix]];
					uint32_t b = a;

					b &= 0x40100400;
					b = b - (b >> 5);
					a &= b;
					a |= 0x01f07c1f;
					dest[i] = RGB32k.All[a & (a >> 15)];
				}
				dc_wall_texturefrac[i] += dc_wall_iscale[i];
			}
			dest += _pitch;
		} while (--count);
	}